

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void __thiscall Memory::HeapInfo::FlushBackgroundPages(HeapInfo *this)

{
  IdleDecommitPageAllocator *in_RSI;
  
  FlushBackgroundPages::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&this->recyclerPageAllocator,in_RSI);
  FlushBackgroundPages::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&this->recyclerLargeBlockPageAllocator,in_RSI);
  FlushBackgroundPages::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&this->recyclerWithBarrierPageAllocator,in_RSI);
  FlushBackgroundPages::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this->recyclerLeafPageAllocator,in_RSI);
  return;
}

Assistant:

void
HeapInfo::FlushBackgroundPages()
{
    ForEachPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->SuspendIdleDecommit();
        pageAlloc->FlushBackgroundPages();
        pageAlloc->ResumeIdleDecommit();
    });
}